

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall cmGeneratorTarget::HasImportLibrary(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  ManagedType MVar3;
  
  bVar1 = cmTarget::IsDLLPlatform(this->Target);
  if ((bVar1) &&
     (((TVar2 = cmTarget::GetType(this->Target), TVar2 == SHARED_LIBRARY ||
       (bVar1 = IsExecutableWithExports(this), bVar1)) &&
      (MVar3 = GetManagedType(this,config), MVar3 != Managed)))) {
    return true;
  }
  bVar1 = cmTarget::IsAIX(this->Target);
  if (!bVar1) {
    return false;
  }
  bVar1 = IsExecutableWithExports(this);
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::HasImportLibrary(std::string const& config) const
{
  return (this->IsDLLPlatform() &&
          (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
           this->IsExecutableWithExports()) &&
          // Assemblies which have only managed code do not have
          // import libraries.
          this->GetManagedType(config) != ManagedType::Managed) ||
    (this->Target->IsAIX() && this->IsExecutableWithExports());
}